

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O2

char * __thiscall
CVmObjStringBuffer::substr_to_string
          (CVmObjStringBuffer *this,vm_val_t *new_str,int32_t idx,int32_t len)

{
  CVmObjPageEntry *pCVar1;
  vm_obj_id_t vVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  wchar_t *src;
  utf8_ptr p;
  int local_40;
  int local_3c;
  utf8_ptr local_38;
  
  pcVar5 = (this->super_CVmObject).ext_;
  local_40 = len;
  local_3c = idx;
  adjust_args(this,&local_3c,&local_40,(int32_t *)0x0);
  local_38.p_ = (char *)0x0;
  src = (wchar_t *)(pcVar5 + (long)local_3c * 4 + 0xc);
  sVar4 = utf8_ptr::setwchars(&local_38,src,(long)local_40,0);
  vVar2 = CVmObjString::create(0,(long)(int)sVar4);
  new_str->typ = VM_OBJ;
  (new_str->val).obj = vVar2;
  pCVar1 = G_obj_table_X.pages_[vVar2 >> 0xc];
  uVar3 = vVar2 & 0xfff;
  local_38.p_ = (char *)(*(long *)((long)&pCVar1[uVar3].ptr_ + 8) + 2);
  utf8_ptr::setwchars(&local_38,src,(long)local_40,(long)(int)sVar4);
  pcVar5 = (char *)(**(code **)(*(long *)&pCVar1[uVar3].ptr_ + 0x1a8))(pCVar1 + uVar3);
  return pcVar5;
}

Assistant:

const char *CVmObjStringBuffer::substr_to_string(
    VMG_ vm_val_t *new_str, int32_t idx, int32_t len) const
{
    vm_strbuf_ext *ext = get_ext();

    /* keep the arguments within our limits */
    adjust_args(&idx, &len, 0);

    /* calculate the size in bytes of the UTF-8 version of the string */
    utf8_ptr p;
    int32_t bytelen = p.setwchars(ext->buf + idx, len, 0);

    /* allocate a string */
    new_str->set_obj(CVmObjString::create(vmg_ FALSE, bytelen));
    CVmObjString *str = (CVmObjString *)vm_objp(vmg_ new_str->val.obj);

    /* translate the string to UTF-8 into the buffer */
    p.set(str->cons_get_buf());
    p.setwchars(ext->buf + idx, len, bytelen);

    /* return the new string buffer */
    return str->get_as_string(vmg0_);
}